

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextStrToUtf8(char *out_buf,int out_buf_size,ImWchar *in_text,ImWchar *in_text_end)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  uint c;
  char *buf_end;
  char *buf_p;
  ImWchar *in_text_end_local;
  ImWchar *in_text_local;
  int out_buf_size_local;
  char *out_buf_local;
  
  buf_end = out_buf;
  in_text_end_local = in_text;
  while( true ) {
    bVar3 = false;
    if ((buf_end < out_buf + out_buf_size + -1) &&
       ((in_text_end == (ImWchar *)0x0 || (bVar3 = false, in_text_end_local < in_text_end)))) {
      bVar3 = *in_text_end_local != 0;
    }
    if (!bVar3) break;
    uVar1 = *in_text_end_local;
    if (uVar1 < 0x80) {
      *buf_end = (char)uVar1;
      buf_end = buf_end + 1;
      in_text_end_local = in_text_end_local + 1;
    }
    else {
      iVar2 = ImTextCharToUtf8_inline
                        (buf_end,((int)(out_buf + out_buf_size) - (int)buf_end) + -1,(uint)uVar1);
      buf_end = buf_end + iVar2;
      in_text_end_local = in_text_end_local + 1;
    }
  }
  *buf_end = '\0';
  return (int)buf_end - (int)out_buf;
}

Assistant:

int ImTextStrToUtf8(char* out_buf, int out_buf_size, const ImWchar* in_text, const ImWchar* in_text_end)
{
    char* buf_p = out_buf;
    const char* buf_end = out_buf + out_buf_size;
    while (buf_p < buf_end - 1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            *buf_p++ = (char)c;
        else
            buf_p += ImTextCharToUtf8_inline(buf_p, (int)(buf_end - buf_p - 1), c);
    }
    *buf_p = 0;
    return (int)(buf_p - out_buf);
}